

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPSources::ProcessRTCPCompoundPacket
          (RTPSources *this,RTCPCompoundPacket *rtcpcomppack,RTPTime *receivetime,
          RTPAddress *senderaddress)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  RTPInternalSourceData *pRVar4;
  _List_node_base *p_Var5;
  int iVar6;
  uint32_t uVar7;
  _Self __tmp;
  _List_node_base *p_Var8;
  bool bVar9;
  ushort uVar10;
  uint uVar11;
  size_t sVar12;
  byte *reasondata;
  byte *pbVar13;
  uint8_t uVar14;
  ItemType t;
  long lVar15;
  long lVar16;
  RTCPAPPPacket *p;
  byte bVar17;
  uint32_t uVar18;
  _List_node_base *p_Var19;
  uint32_t uVar20;
  void *pvVar21;
  size_t valuelen;
  uint32_t uVar22;
  void *valuedata;
  uint32_t uVar23;
  ulong uVar24;
  ulong uVar25;
  uint local_54;
  RTPNTPTime local_38;
  
  pRVar4 = this->owndata;
  local_54 = 0;
  if (pRVar4 != (RTPInternalSourceData *)0x0) {
    local_54 = (pRVar4->super_RTPSourceData).ssrc;
  }
  (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[3])
            (this,rtcpcomppack,receivetime,senderaddress);
  p_Var8 = (rtcpcomppack->rtcppacklist).
           super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  (rtcpcomppack->rtcppackit)._M_node = p_Var8;
  if (p_Var8 == (_List_node_base *)&rtcpcomppack->rtcppacklist) {
    return 0;
  }
LAB_0012835a:
  p_Var5 = p_Var8[1]._M_next;
  (rtcpcomppack->rtcppackit)._M_node = p_Var8->_M_next;
  if (p_Var5 == (_List_node_base *)0x0) {
    return 0;
  }
  if (*(char *)&p_Var5[1]._M_prev != '\x01') {
    (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x11])
              (this,p_Var5,receivetime,senderaddress);
    goto LAB_00128972;
  }
  switch(*(undefined4 *)((long)&p_Var5[1]._M_prev + 4)) {
  case 0:
    p_Var8 = p_Var5->_M_prev;
    uVar11 = *(uint *)((long)&p_Var8->_M_next + 4);
    uVar3 = *(uint *)((long)&p_Var8->_M_prev + 4);
    uVar24 = (ulong)*(uint *)&p_Var8->_M_prev << 0x20;
    local_38 = (RTPNTPTime)
               (uVar24 >> 0x38 | (uVar24 & 0xff000000000000) >> 0x28 |
                (uVar24 & 0xff0000000000) >> 0x18 | (uVar24 & 0xff00000000) >> 8 |
                ((ulong)uVar3 & 0xff000000) << 8 | ((ulong)uVar3 & 0xff0000) << 0x18 |
                ((ulong)uVar3 & 0xff00) << 0x28 | CONCAT44(*(uint *)&p_Var8->_M_prev,uVar3) << 0x38)
    ;
    uVar18 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    uVar11 = *(uint *)&p_Var8[1]._M_next;
    uVar3 = *(uint *)((long)&p_Var8[1]._M_next + 4);
    uVar2 = *(uint *)&p_Var8[1]._M_prev;
    iVar6 = ProcessRTCPSenderInfo
                      (this,uVar18,&local_38,
                       uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                       uVar11 << 0x18,
                       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18,
                       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18,receivetime,senderaddress);
    if (iVar6 < 0) {
      return iVar6;
    }
    if (((pRVar4 != (RTPInternalSourceData *)0x0) && (*(char *)&p_Var5[1]._M_prev == '\x01')) &&
       (bVar17 = *(byte *)&p_Var5->_M_prev->_M_next, uVar24 = (ulong)bVar17 & 0x1f,
       (bVar17 & 0x1f) != 0)) {
      uVar25 = 0;
      bVar9 = false;
LAB_0012841b:
      lVar15 = uVar25 * 0x18 + 0x30;
      do {
        uVar25 = uVar25 + 1;
        if (*(char *)&p_Var5[1]._M_prev == '\0') {
          if (local_54 == 0) {
            uVar23 = 0;
            uVar20 = 0;
            uVar14 = '\0';
            uVar11 = 0;
            uVar22 = 0;
            uVar7 = 0;
            goto LAB_001284c1;
          }
        }
        else {
          p_Var8 = p_Var5->_M_prev;
          uVar11 = *(uint *)((long)p_Var8 + lVar15 + -0x14);
          if ((uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18)
              == local_54) goto LAB_00128474;
        }
        lVar15 = lVar15 + 0x18;
        if (uVar25 == uVar24) goto LAB_00128957;
      } while( true );
    }
    goto LAB_0012895c;
  case 1:
    uVar11 = *(uint *)((long)&p_Var5->_M_prev->_M_next + 4);
    uVar18 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    if ((pRVar4 != (RTPInternalSourceData *)0x0) &&
       (bVar17 = *(byte *)&p_Var5->_M_prev->_M_next, uVar24 = (ulong)bVar17 & 0x1f,
       (bVar17 & 0x1f) != 0)) {
      uVar25 = 0;
      bVar9 = false;
LAB_00128869:
      lVar15 = uVar25 * 0x18 + 0x1c;
      do {
        uVar25 = uVar25 + 1;
        if (*(char *)&p_Var5[1]._M_prev == '\0') {
          if (local_54 == 0) {
            uVar23 = 0;
            uVar20 = 0;
            uVar14 = '\0';
            uVar11 = 0;
            uVar22 = 0;
            uVar7 = 0;
            goto LAB_0012890f;
          }
        }
        else {
          p_Var8 = p_Var5->_M_prev;
          uVar11 = *(uint *)((long)p_Var8 + lVar15 + -0x14);
          if ((uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18)
              == local_54) goto LAB_001288c2;
        }
        lVar15 = lVar15 + 0x18;
        if (uVar25 == uVar24) goto LAB_00128957;
      } while( true );
    }
    goto LAB_0012895c;
  case 2:
    if (((ulong)p_Var5->_M_prev->_M_next & 0x1f) != 0) {
      p_Var8 = (_List_node_base *)((long)&p_Var5->_M_prev->_M_next + 4);
      p_Var5[2]._M_next = p_Var8;
      *(undefined4 *)&p_Var5[2]._M_prev = 1;
      bVar17 = 1;
      do {
        p_Var5[3]._M_next = (_List_node_base *)0x4;
        uVar18 = 0;
        if ((bVar17 & 1) != 0) {
          uVar11 = *(uint *)&p_Var8->_M_next;
          uVar18 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18;
          bVar1 = *(byte *)((long)&p_Var8->_M_next + 4);
          if (bVar1 != 0) {
            p_Var19 = (_List_node_base *)0x4;
            do {
              sVar12 = 0;
              t = None;
              pvVar21 = (void *)0x0;
              if ((bVar17 & 1) != 0) {
                t = (ItemType)bVar1;
                switch(t) {
                case CNAME:
                  break;
                case NAME:
                  t = NAME;
                  break;
                case EMAIL:
                  t = EMAIL;
                  break;
                case PHONE:
                  t = PHONE;
                  break;
                case LOC:
                  t = LOC;
                  break;
                case TOOL:
                  t = TOOL;
                  break;
                case NOTE:
                  t = NOTE;
                  break;
                case PRIV:
                  bVar17 = *(byte *)((long)&p_Var8->_M_next + (long)((long)&p_Var19->_M_next + 1));
                  if (bVar17 == 0) {
                    sVar12 = 0;
                  }
                  else {
                    bVar1 = *(byte *)((long)&p_Var8->_M_next + (long)((long)&p_Var19->_M_next + 2));
                    sVar12 = 0;
                    if ((uint)bVar1 <= bVar17 - 1) {
                      sVar12 = (ulong)bVar1;
                    }
                  }
                  bVar17 = *(byte *)((long)&p_Var8->_M_next + (long)((long)&p_Var19->_M_next + 1));
                  if (bVar17 == 0) {
                    pvVar21 = (void *)0x0;
                  }
                  else {
                    bVar1 = *(byte *)((long)&p_Var8->_M_next + (long)((long)&p_Var19->_M_next + 2));
                    pvVar21 = (void *)0x0;
                    if ((uint)bVar1 <= bVar17 - 1) {
                      pvVar21 = (void *)((long)&p_Var8->_M_next +
                                        (long)((long)&p_Var19->_M_next + 3));
                    }
                    if (bVar1 == 0) {
                      pvVar21 = (void *)0x0;
                    }
                  }
                  bVar17 = *(byte *)((long)&p_Var8->_M_next + (long)((long)&p_Var19->_M_next + 1));
                  if ((ulong)bVar17 == 0) {
                    valuelen = 0;
                  }
                  else {
                    bVar1 = *(byte *)((long)&p_Var8->_M_next + (long)((long)&p_Var19->_M_next + 2));
                    valuelen = 0;
                    if ((uint)bVar1 <= bVar17 - 1) {
                      valuelen = ~(ulong)bVar1 + (ulong)bVar17;
                    }
                  }
                  bVar17 = *(byte *)((long)&p_Var8->_M_next + (long)((long)&p_Var19->_M_next + 1));
                  if (((ulong)bVar17 == 0) ||
                     (bVar1 = *(byte *)((long)&p_Var8->_M_next + (long)((long)&p_Var19->_M_next + 2)
                                       ), bVar17 - 1 < (uint)bVar1)) {
                    valuedata = (void *)0x0;
                  }
                  else {
                    valuedata = (void *)0x0;
                    if ((ulong)bVar17 - 1 != (ulong)bVar1) {
                      valuedata = (void *)((long)&p_Var8->_M_next +
                                          (long)&p_Var19->_M_next + (ulong)bVar1 + 3);
                    }
                  }
                  iVar6 = ProcessSDESPrivateItem
                                    (this,uVar18,sVar12,pvVar21,valuelen,valuedata,receivetime,
                                     senderaddress);
                  goto LAB_00128622;
                default:
                  t = Unknown;
                }
                pvVar21 = (void *)((long)&p_Var8->_M_next + (long)((long)&p_Var19->_M_next + 2));
                sVar12 = (size_t)*(byte *)((long)&p_Var8->_M_next +
                                          (long)((long)&p_Var19->_M_next + 1));
              }
              iVar6 = ProcessSDESNormalItem(this,uVar18,t,sVar12,pvVar21,receivetime,senderaddress);
LAB_00128622:
              if (iVar6 < 0) {
                return iVar6;
              }
              bVar17 = *(byte *)&p_Var5[1]._M_prev;
              if (((bVar17 != 1) || (p_Var8 = p_Var5[2]._M_next, p_Var8 == (_List_node_base *)0x0))
                 || (p_Var19 = p_Var5[3]._M_next,
                    *(char *)((long)&p_Var8->_M_next + (long)p_Var19) == '\0')) goto LAB_00128748;
              uVar24 = (ulong)*(byte *)((long)&p_Var8->_M_next + (long)((long)&p_Var19->_M_next + 1)
                                       );
              bVar1 = *(byte *)((long)&p_Var8->_M_next + (long)&p_Var19->_M_next + uVar24 + 2);
              if (bVar1 == 0) goto LAB_00128748;
              p_Var19 = (_List_node_base *)((long)&p_Var19->_M_next + uVar24 + 2);
              p_Var5[3]._M_next = p_Var19;
            } while( true );
          }
        }
        iVar6 = UpdateReceiveTime(this,uVar18,receivetime,senderaddress);
        if (iVar6 < 0) {
          return iVar6;
        }
        bVar17 = *(byte *)&p_Var5[1]._M_prev;
LAB_00128748:
        if ((((bVar17 & 1) == 0) || (p_Var8 = p_Var5[2]._M_next, p_Var8 == (_List_node_base *)0x0))
           || (*(uint *)&p_Var5[2]._M_prev == (*(byte *)&p_Var5->_M_prev->_M_next & 0x1f)))
        goto LAB_00128972;
        if (*(char *)((long)&p_Var8->_M_next + 4) == '\0') {
          lVar15 = 4;
        }
        else {
          lVar15 = 4;
          do {
            uVar24 = (ulong)*(byte *)((long)&p_Var8->_M_next + lVar15 + 1);
            lVar16 = lVar15 + uVar24;
            lVar15 = lVar15 + uVar24 + 2;
          } while (*(char *)((long)&p_Var8->_M_next + lVar16 + 2) != '\0');
        }
        uVar24 = (ulong)((uint)(lVar15 + 1) & 3);
        lVar16 = (lVar15 - uVar24) + 5;
        if (uVar24 == 0) {
          lVar16 = lVar15 + 1;
        }
        p_Var8 = (_List_node_base *)((long)&p_Var8->_M_next + lVar16);
        p_Var5[2]._M_next = p_Var8;
        *(uint *)&p_Var5[2]._M_prev = *(uint *)&p_Var5[2]._M_prev + 1;
      } while( true );
    }
    p_Var5[2]._M_next = (_List_node_base *)0x0;
    break;
  case 3:
    bVar17 = *(byte *)&p_Var5->_M_prev->_M_next;
    if ((bVar17 & 0x1f) != 0) {
      uVar24 = 0;
      do {
        sVar12 = 0;
        uVar18 = 0;
        reasondata = (byte *)0x0;
        if (*(char *)&p_Var5[1]._M_prev == '\x01') {
          uVar11 = *(uint *)((long)&p_Var5->_M_prev->_M_next + uVar24 * 4 + 4);
          uVar18 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18;
          if (p_Var5[2]._M_next == (_List_node_base *)0x0) {
            sVar12 = 0;
            reasondata = (byte *)0x0;
          }
          else {
            pbVar13 = (byte *)((long)&p_Var5->_M_prev->_M_next + (long)p_Var5[2]._M_next);
            reasondata = pbVar13 + 1;
            sVar12 = (size_t)*pbVar13;
            if (sVar12 == 0) {
              reasondata = (byte *)0x0;
            }
          }
        }
        iVar6 = ProcessBYE(this,uVar18,sVar12,reasondata,receivetime,senderaddress);
        if (iVar6 < 0) {
          return iVar6;
        }
        uVar24 = uVar24 + 1;
      } while (((ulong)bVar17 & 0x1f) != uVar24);
    }
    break;
  case 4:
    (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xf])
              (this,p_Var5,receivetime,senderaddress);
    break;
  default:
    (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x10])
              (this,p_Var5,receivetime,senderaddress);
  }
  goto LAB_00128972;
LAB_001288c2:
  uVar14 = *(uint8_t *)((long)&p_Var8[-1]._M_next + lVar15);
  uVar10 = *(ushort *)((long)p_Var8 + lVar15 + -0xe);
  uVar10 = uVar10 << 8 | uVar10 >> 8;
  bVar17 = *(byte *)((long)p_Var8 + lVar15 + -0xf);
  uVar11 = ((uint)uVar10 + (uint)bVar17 * 0x10000) - 0x1000000;
  if (-1 < (char)bVar17) {
    uVar11 = (uint)CONCAT12(bVar17,uVar10);
  }
  uVar3 = *(uint *)((long)p_Var8 + lVar15 + -0xc);
  uVar20 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = *(uint *)((long)p_Var8 + lVar15 + -8);
  uVar22 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = *(uint *)((long)p_Var8 + lVar15 + -4);
  uVar23 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = *(uint *)((long)&p_Var8->_M_next + lVar15);
  uVar7 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
LAB_0012890f:
  iVar6 = ProcessRTCPReportBlock
                    (this,uVar18,uVar14,uVar11,uVar20,uVar22,uVar23,uVar7,receivetime,senderaddress)
  ;
  if (iVar6 < 0) {
    return iVar6;
  }
  bVar9 = true;
  if (uVar25 == uVar24) goto LAB_00128972;
  goto LAB_00128869;
LAB_00128474:
  uVar14 = *(uint8_t *)((long)&p_Var8[-1]._M_next + lVar15);
  uVar10 = *(ushort *)((long)p_Var8 + lVar15 + -0xe);
  uVar10 = uVar10 << 8 | uVar10 >> 8;
  bVar17 = *(byte *)((long)p_Var8 + lVar15 + -0xf);
  uVar11 = ((uint)uVar10 + (uint)bVar17 * 0x10000) - 0x1000000;
  if (-1 < (char)bVar17) {
    uVar11 = (uint)CONCAT12(bVar17,uVar10);
  }
  uVar3 = *(uint *)((long)p_Var8 + lVar15 + -0xc);
  uVar20 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = *(uint *)((long)p_Var8 + lVar15 + -8);
  uVar22 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = *(uint *)((long)p_Var8 + lVar15 + -4);
  uVar23 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = *(uint *)((long)&p_Var8->_M_next + lVar15);
  uVar7 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
LAB_001284c1:
  iVar6 = ProcessRTCPReportBlock
                    (this,uVar18,uVar14,uVar11,uVar20,uVar22,uVar23,uVar7,receivetime,senderaddress)
  ;
  if (iVar6 < 0) {
    return iVar6;
  }
  bVar9 = true;
  if (uVar25 == uVar24) goto LAB_00128972;
  goto LAB_0012841b;
LAB_00128957:
  if (!bVar9) {
LAB_0012895c:
    iVar6 = UpdateReceiveTime(this,uVar18,receivetime,senderaddress);
    if (iVar6 < 0) {
      return iVar6;
    }
  }
LAB_00128972:
  p_Var8 = (rtcpcomppack->rtcppackit)._M_node;
  if (p_Var8 == (_List_node_base *)&rtcpcomppack->rtcppacklist) {
    return 0;
  }
  goto LAB_0012835a;
}

Assistant:

int RTPSources::ProcessRTCPCompoundPacket(RTCPCompoundPacket *rtcpcomppack,const RTPTime &receivetime,const RTPAddress *senderaddress)
{
	RTCPPacket *rtcppack;
	int status;
	bool gotownssrc = ((owndata == 0)?false:true);
	uint32_t ownssrc = ((owndata != 0)?owndata->GetSSRC():0);
	
	OnRTCPCompoundPacket(rtcpcomppack,receivetime,senderaddress);
	
	rtcpcomppack->GotoFirstPacket();	
	while ((rtcppack = rtcpcomppack->GetNextPacket()) != 0)
	{
		if (rtcppack->IsKnownFormat())
		{
			switch (rtcppack->GetPacketType())
			{
			case RTCPPacket::SR:
				{
					RTCPSRPacket *p = (RTCPSRPacket *)rtcppack;
					uint32_t senderssrc = p->GetSenderSSRC();
					
					status = ProcessRTCPSenderInfo(senderssrc,p->GetNTPTimestamp(),p->GetRTPTimestamp(),
						                       p->GetSenderPacketCount(),p->GetSenderOctetCount(),
								       receivetime,senderaddress);
					if (status < 0)
						return status;
					
					bool gotinfo = false;
					if (gotownssrc)
					{
						int i;
						int num = p->GetReceptionReportCount();
						for (i = 0 ; i < num ; i++)
						{
							if (p->GetSSRC(i) == ownssrc) // data is meant for us
							{
								gotinfo = true;
								status = ProcessRTCPReportBlock(senderssrc,p->GetFractionLost(i),p->GetLostPacketCount(i),
										                        p->GetExtendedHighestSequenceNumber(i),p->GetJitter(i),p->GetLSR(i),
													p->GetDLSR(i),receivetime,senderaddress);
								if (status < 0)
									return status;
							}
						}
					}
					if (!gotinfo)
					{
						status = UpdateReceiveTime(senderssrc,receivetime,senderaddress);
						if (status < 0)
							return status;
					}
				}
				break;
			case RTCPPacket::RR:
				{
					RTCPRRPacket *p = (RTCPRRPacket *)rtcppack;
					uint32_t senderssrc = p->GetSenderSSRC();
					
					bool gotinfo = false;

					if (gotownssrc)
					{
						int i;
						int num = p->GetReceptionReportCount();
						for (i = 0 ; i < num ; i++)
						{
							if (p->GetSSRC(i) == ownssrc)
							{
								gotinfo = true;
								status = ProcessRTCPReportBlock(senderssrc,p->GetFractionLost(i),p->GetLostPacketCount(i),
										                        p->GetExtendedHighestSequenceNumber(i),p->GetJitter(i),p->GetLSR(i),
													p->GetDLSR(i),receivetime,senderaddress);
								if (status < 0)
									return status;
							}
						}
					}
					if (!gotinfo)
					{
						status = UpdateReceiveTime(senderssrc,receivetime,senderaddress);
						if (status < 0)
							return status;
					}
				}
				break;
			case RTCPPacket::SDES:
				{
					RTCPSDESPacket *p = (RTCPSDESPacket *)rtcppack;
					
					if (p->GotoFirstChunk())
					{
						do
						{
							uint32_t sdesssrc = p->GetChunkSSRC();
							bool updated = false;
							if (p->GotoFirstItem())
							{
								do
								{
									RTCPSDESPacket::ItemType t;
				
									if ((t = p->GetItemType()) != RTCPSDESPacket::PRIV)
									{
										updated = true;
										status = ProcessSDESNormalItem(sdesssrc,t,p->GetItemLength(),p->GetItemData(),receivetime,senderaddress);
										if (status < 0)
											return status;
									}
#ifdef RTP_SUPPORT_SDESPRIV
									else
									{
										updated = true;
										status = ProcessSDESPrivateItem(sdesssrc,p->GetPRIVPrefixLength(),p->GetPRIVPrefixData(),p->GetPRIVValueLength(),
												                        p->GetPRIVValueData(),receivetime,senderaddress);
										if (status < 0)
											return status;
									}
#endif // RTP_SUPPORT_SDESPRIV
								} while (p->GotoNextItem());
							}
							if (!updated)
							{
								status = UpdateReceiveTime(sdesssrc,receivetime,senderaddress);
								if (status < 0)
									return status;
							}
						} while (p->GotoNextChunk());
					}
				}
				break;
			case RTCPPacket::BYE:
				{
					RTCPBYEPacket *p = (RTCPBYEPacket *)rtcppack;
					int i;
					int num = p->GetSSRCCount();

					for (i = 0 ; i < num ; i++)
					{
						uint32_t byessrc = p->GetSSRC(i);
						status = ProcessBYE(byessrc,p->GetReasonLength(),p->GetReasonData(),receivetime,senderaddress);
						if (status < 0)
							return status;
					}
				}
				break;
			case RTCPPacket::APP:
				{
					RTCPAPPPacket *p = (RTCPAPPPacket *)rtcppack;

					OnAPPPacket(p,receivetime,senderaddress);
				}
				break; 
			case RTCPPacket::Unknown:
			default:
				{
					OnUnknownPacketType(rtcppack,receivetime,senderaddress);
				}
				break;
			}
		}
		else
		{
			OnUnknownPacketFormat(rtcppack,receivetime,senderaddress);
		}
	}

	return 0;
}